

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::readArray(Reader *this,Token *param_1)

{
  int index_00;
  Value *pVVar1;
  bool local_da;
  bool local_d9;
  allocator<char> local_c1;
  string local_c0;
  bool local_99;
  undefined1 local_98 [7];
  bool badTokenType;
  Token token;
  Value *pVStack_78;
  bool ok;
  Value *local_70;
  Value *value;
  undefined1 local_60 [4];
  int index;
  Token endArray;
  Value local_38;
  Token *local_20;
  Token *param_1_local;
  Reader *this_local;
  
  local_20 = param_1;
  param_1_local = (Token *)this;
  Value::Value(&local_38,arrayValue);
  pVVar1 = currentValue(this);
  Value::operator=(pVVar1,&local_38);
  Value::~Value(&local_38);
  skipSpaces(this);
  if (*this->current_ == ']') {
    readToken(this,(Token *)local_60);
    this_local._7_1_ = 1;
  }
  else {
    value._4_4_ = 0;
    do {
      pVVar1 = currentValue(this);
      index_00 = value._4_4_;
      value._4_4_ = value._4_4_ + 1;
      pVStack_78 = Value::operator[](pVVar1,index_00);
      local_70 = pVStack_78;
      std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
                (&this->nodes_,&stack0xffffffffffffff88);
      token.end_._7_1_ = readValue(this);
      std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
                (&this->nodes_);
      if ((token.end_._7_1_ & 1) == 0) {
        this_local._7_1_ = recoverFromError(this,tokenArrayEnd);
        goto LAB_0016fbae;
      }
      token.end_._7_1_ = readToken(this,(Token *)local_98);
      while( true ) {
        local_d9 = false;
        if (local_98._0_4_ == tokenComment) {
          local_d9 = (bool)token.end_._7_1_;
        }
        if (local_d9 == false) break;
        token.end_._7_1_ = readToken(this,(Token *)local_98);
      }
      local_da = local_98._0_4_ != tokenArraySeparator && local_98._0_4_ != tokenArrayEnd;
      local_99 = local_da;
      if (((bool)token.end_._7_1_ == false) ||
         (local_98._0_4_ != tokenArraySeparator && local_98._0_4_ != tokenArrayEnd)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"Missing \',\' or \']\' in array declaration",&local_c1);
        this_local._7_1_ = addErrorAndRecover(this,&local_c0,(Token *)local_98,tokenArrayEnd);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        goto LAB_0016fbae;
      }
    } while (local_98._0_4_ != tokenArrayEnd);
    this_local._7_1_ = 1;
  }
LAB_0016fbae:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool 
Reader::readArray( Token &/*tokenStart*/ )
{
   currentValue() = Value( arrayValue );
   skipSpaces();
   if ( *current_ == ']' ) // empty array
   {
      Token endArray;
      readToken( endArray );
      return true;
   }
   int index = 0;
   for (;;)
   {
      Value &value = currentValue()[ index++ ];
      nodes_.push( &value );
      bool ok = readValue();
      nodes_.pop();
      if ( !ok ) // error already set
         return recoverFromError( tokenArrayEnd );

      Token token;
      // Accept Comment after last item in the array.
      ok = readToken( token );
      while ( token.type_ == tokenComment  &&  ok )
      {
         ok = readToken( token );
      }
      bool badTokenType = ( token.type_ != tokenArraySeparator  &&
                            token.type_ != tokenArrayEnd );
      if ( !ok  ||  badTokenType )
      {
         return addErrorAndRecover( "Missing ',' or ']' in array declaration", 
                                    token, 
                                    tokenArrayEnd );
      }
      if ( token.type_ == tokenArrayEnd )
         break;
   }
   return true;
}